

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

htmlStatus htmlAttrAllowed(htmlElemDesc *elt,xmlChar *attr,int legacy)

{
  xmlChar *pxVar1;
  int iVar2;
  char **ppcVar3;
  
  if (attr != (xmlChar *)0x0 && elt != (htmlElemDesc *)0x0) {
    ppcVar3 = elt->attrs_req;
    if (ppcVar3 != (char **)0x0) {
      pxVar1 = (xmlChar *)*ppcVar3;
      while (pxVar1 != (xmlChar *)0x0) {
        ppcVar3 = ppcVar3 + 1;
        iVar2 = xmlStrcmp(pxVar1,attr);
        if (iVar2 == 0) {
          return HTML_REQUIRED;
        }
        pxVar1 = (xmlChar *)*ppcVar3;
      }
    }
    ppcVar3 = elt->attrs_opt;
    if (ppcVar3 != (char **)0x0) {
      pxVar1 = (xmlChar *)*ppcVar3;
      while (pxVar1 != (xmlChar *)0x0) {
        ppcVar3 = ppcVar3 + 1;
        iVar2 = xmlStrcmp(pxVar1,attr);
        if (iVar2 == 0) {
          return HTML_VALID;
        }
        pxVar1 = (xmlChar *)*ppcVar3;
      }
    }
    if ((legacy != 0) && (ppcVar3 = elt->attrs_depr, ppcVar3 != (char **)0x0)) {
      pxVar1 = (xmlChar *)*ppcVar3;
      while (pxVar1 != (xmlChar *)0x0) {
        ppcVar3 = ppcVar3 + 1;
        iVar2 = xmlStrcmp(pxVar1,attr);
        if (iVar2 == 0) {
          return HTML_DEPRECATED;
        }
        pxVar1 = (xmlChar *)*ppcVar3;
      }
    }
  }
  return HTML_INVALID;
}

Assistant:

htmlStatus
htmlAttrAllowed(const htmlElemDesc* elt, const xmlChar* attr, int legacy) {
  const char** p ;

  if ( !elt || ! attr )
	return HTML_INVALID ;

  if ( elt->attrs_req )
    for ( p = elt->attrs_req; *p; ++p)
      if ( !xmlStrcmp((const xmlChar*)*p, attr) )
        return HTML_REQUIRED ;

  if ( elt->attrs_opt )
    for ( p = elt->attrs_opt; *p; ++p)
      if ( !xmlStrcmp((const xmlChar*)*p, attr) )
        return HTML_VALID ;

  if ( legacy && elt->attrs_depr )
    for ( p = elt->attrs_depr; *p; ++p)
      if ( !xmlStrcmp((const xmlChar*)*p, attr) )
        return HTML_DEPRECATED ;

  return HTML_INVALID ;
}